

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrEndFrame(XrSession session,XrFrameEndInfo *frameEndInfo)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_2c;
  LoaderInstance *pLStack_28;
  XrResult result;
  LoaderInstance *loader_instance;
  XrFrameEndInfo *frameEndInfo_local;
  XrSession session_local;
  
  loader_instance = (LoaderInstance *)frameEndInfo;
  frameEndInfo_local = (XrFrameEndInfo *)session;
  local_2c = ActiveLoaderInstance::Get(&stack0xffffffffffffffd8,"xrEndFrame");
  if (XR_ERROR_VALIDATION_FAILURE < local_2c) {
    this = LoaderInstance::DispatchTable(pLStack_28);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_2c = (*pXVar1->EndFrame)((XrSession)frameEndInfo_local,(XrFrameEndInfo *)loader_instance);
  }
  return local_2c;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrEndFrame(
    XrSession                                   session,
    const XrFrameEndInfo*                       frameEndInfo) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrEndFrame");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->EndFrame(session, frameEndInfo);
    }
    return result;
}